

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O1

bool __thiscall wasm::EffectAnalyzer::invalidates(EffectAnalyzer *this,EffectAnalyzer *other)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  _Base_ptr p_Var4;
  const_iterator cVar5;
  bool bVar6;
  key_type local_58;
  _Rb_tree_node_base *local_40;
  _Base_ptr local_38;
  
  if (((((((this->branchesOut == false) && (this->throws_ == false)) &&
         ((this->delegateTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) &&
        ((this->breakTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) ||
       ((bVar6 = true, other->trap == false && (bVar2 = hasNonTrapSideEffects(other), !bVar2)))) &&
      (((((other->branchesOut == false &&
          ((other->throws_ == false &&
           ((other->delegateTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)))) &&
         ((other->breakTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) ||
        ((bVar6 = true, this->trap == false && (bVar2 = hasNonTrapSideEffects(this), !bVar2)))) &&
       (((((((bVar2 = this->writesMemory, bVar2 == false && (this->calls != true)) ||
            (((bVar6 = true, other->calls == false && (other->readsMemory == false)) &&
             (other->writesMemory == false)))) &&
           (((other->writesMemory == false && (other->calls != true)) ||
            ((bVar6 = true, this->calls == false && (((this->readsMemory | bVar2) & 1U) == 0))))))
          && (((this->writesTable == false && (this->calls != true)) ||
              ((bVar6 = true, other->calls == false &&
               ((other->readsTable == false && (other->writesTable == false)))))))) &&
         (((other->writesTable == false && (other->calls != true)) ||
          ((bVar6 = true, this->calls == false &&
           (((this->writesTable | this->readsTable) & 1U) == 0)))))) &&
        ((((this->writesStruct == false && (this->calls != true)) ||
          (((bVar6 = true, other->calls == false && (other->readsMutableStruct == false)) &&
           (other->writesStruct == false)))) &&
         ((((other->writesStruct == false && (other->calls != true)) ||
           ((bVar6 = true, this->calls == false &&
            (((this->writesStruct | this->readsMutableStruct) & 1U) == 0)))) &&
          (((this->writesArray == false && (this->calls != true)) ||
           ((bVar6 = true, other->calls == false &&
            ((other->readsArray == false && (other->writesArray == false)))))))))))))))) &&
     ((((other->writesArray == false && (other->calls != true)) ||
       ((bVar6 = true, this->calls == false && (((this->writesArray | this->readsArray) & 1U) == 0))
       )) && (((bVar6 = true, this->danglingPop == false && (other->danglingPop == false)) &&
              (((this->isAtomic != true ||
                ((other->calls == false && (((other->writesMemory | other->readsMemory) & 1U) == 0))
                )) && ((other->isAtomic != true ||
                       ((this->calls == false && (((bVar2 | this->readsMemory) & 1U) == 0)))))))))))
     ) {
    p_Var4 = (this->localsWritten)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_40 = &(this->localsWritten)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_38 = (_Base_ptr)CONCAT71(local_38._1_7_,p_Var4 == local_40);
    if (p_Var4 != local_40) {
      local_58.super_IString.str._M_len =
           CONCAT44(local_58.super_IString.str._M_len._4_4_,p_Var4[1]._M_color);
      sVar3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::count
                        (&other->localsRead,(key_type *)&local_58);
      if (sVar3 == 0) {
        do {
          sVar3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                  count(&other->localsWritten,(key_type *)&local_58);
          if (sVar3 != 0) break;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
          local_38 = (_Base_ptr)CONCAT71(local_38._1_7_,p_Var4 == local_40);
          if (p_Var4 == local_40) goto LAB_0016216d;
          local_58.super_IString.str._M_len =
               CONCAT44(local_58.super_IString.str._M_len._4_4_,p_Var4[1]._M_color);
          sVar3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                  count(&other->localsRead,(key_type *)&local_58);
        } while (sVar3 == 0);
      }
      if (((ulong)local_38 & 1) == 0) {
        return true;
      }
    }
LAB_0016216d:
    p_Var4 = (this->localsRead)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_38 = &(this->localsRead)._M_t._M_impl.super__Rb_tree_header._M_header;
    bVar2 = p_Var4 == local_38;
    if (!bVar2) {
      local_40 = (_Rb_tree_node_base *)&other->localsWritten;
      local_58.super_IString.str._M_len =
           CONCAT44(local_58.super_IString.str._M_len._4_4_,p_Var4[1]._M_color);
      while (sVar3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::count((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)local_40,(key_type *)&local_58), sVar3 == 0) {
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
        bVar2 = p_Var4 == local_38;
        if (bVar2) goto LAB_001621cd;
        local_58.super_IString.str._M_len =
             CONCAT44(local_58.super_IString.str._M_len._4_4_,p_Var4[1]._M_color);
      }
      if (!bVar2) {
        return true;
      }
    }
LAB_001621cd:
    if (((other->calls != true) ||
        ((this->globalsWritten)._M_t._M_impl.super__Rb_tree_header._M_node_count +
         (this->mutableGlobalsRead)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) &&
       ((this->calls != true ||
        ((other->globalsWritten)._M_t._M_impl.super__Rb_tree_header._M_node_count +
         (other->mutableGlobalsRead)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)))) {
      p_Var4 = (this->globalsWritten)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_40 = &(this->globalsWritten)._M_t._M_impl.super__Rb_tree_header._M_header;
      bVar2 = p_Var4 == local_40;
      if (!bVar2) {
        local_38 = &(other->mutableGlobalsRead)._M_t._M_impl.super__Rb_tree_header._M_header;
        local_58.super_IString.str._M_len = *(size_t *)(p_Var4 + 1);
        local_58.super_IString.str._M_str = (char *)p_Var4[1]._M_parent;
        cVar5 = std::
                _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                ::find(&(other->mutableGlobalsRead)._M_t,&local_58);
        if (cVar5._M_node == local_38) {
          do {
            cVar5 = std::
                    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                    ::find(&(other->globalsWritten)._M_t,&local_58);
            if ((_Rb_tree_header *)cVar5._M_node !=
                &(other->globalsWritten)._M_t._M_impl.super__Rb_tree_header) break;
            p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
            bVar2 = p_Var4 == local_40;
            if (bVar2) goto LAB_0016225a;
            local_58.super_IString.str._M_len = *(size_t *)(p_Var4 + 1);
            local_58.super_IString.str._M_str = (char *)p_Var4[1]._M_parent;
            cVar5 = std::
                    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                    ::find(&(other->mutableGlobalsRead)._M_t,&local_58);
          } while (cVar5._M_node == local_38);
        }
        if (!bVar2) {
          return true;
        }
      }
LAB_0016225a:
      p_Var4 = (this->mutableGlobalsRead)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_40 = &(this->mutableGlobalsRead)._M_t._M_impl.super__Rb_tree_header._M_header;
      bVar2 = p_Var4 == local_40;
      if (!bVar2) {
        local_38 = &(other->globalsWritten)._M_t._M_impl.super__Rb_tree_header._M_header;
        local_58.super_IString.str._M_len = *(size_t *)(p_Var4 + 1);
        local_58.super_IString.str._M_str = (char *)p_Var4[1]._M_parent;
        while (cVar5 = std::
                       _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       ::find(&(other->globalsWritten)._M_t,&local_58), cVar5._M_node == local_38) {
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
          bVar2 = p_Var4 == local_40;
          if (bVar2) goto LAB_0016232d;
          local_58.super_IString.str._M_len = *(size_t *)(p_Var4 + 1);
          local_58.super_IString.str._M_str = (char *)p_Var4[1]._M_parent;
        }
        if (!bVar2) {
          return true;
        }
      }
LAB_0016232d:
      bVar2 = this->trap;
      if (((bVar2 != true) ||
          ((((other->branchesOut == false && (other->throws_ == false)) &&
            ((other->delegateTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) &&
           ((other->breakTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)))) &&
         ((bVar1 = other->trap, bVar1 != true ||
          (((this->branchesOut == false && (this->throws_ == false)) &&
           (((this->delegateTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0 &&
            ((this->breakTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)))))))) {
        if (((bVar2 != false) &&
            ((other->throws_ != false ||
             ((other->delegateTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)))) ||
           ((((this->delegateTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0 |
             this->throws_) & bVar1) == 1)) {
          __assert_fail("!((trap && other.throws()) || (throws() && other.trap))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/effects.h"
                        ,0x118,"bool wasm::EffectAnalyzer::invalidates(const EffectAnalyzer &)");
        }
        if (((bVar2 == false) ||
            (((((other->globalsWritten)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0 &&
               (other->writesMemory == false)) && (other->writesTable == false)) &&
             (((other->writesStruct == false && (other->writesArray == false)) &&
              ((other->isAtomic == false && (other->calls == false)))))))) &&
           ((bVar1 == false ||
            ((((this->globalsWritten)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0 &&
              (this->writesMemory == false)) &&
             (((this->writesTable == false &&
               (((this->writesStruct == false && (this->writesArray == false)) &&
                (this->isAtomic == false)))) && (this->calls == false)))))))) {
          bVar6 = false;
        }
      }
    }
  }
  return bVar6;
}

Assistant:

bool invalidates(const EffectAnalyzer& other) {
    if ((transfersControlFlow() && other.hasSideEffects()) ||
        (other.transfersControlFlow() && hasSideEffects()) ||
        ((writesMemory || calls) && other.accessesMemory()) ||
        ((other.writesMemory || other.calls) && accessesMemory()) ||
        ((writesTable || calls) && other.accessesTable()) ||
        ((other.writesTable || other.calls) && accessesTable()) ||
        ((writesStruct || calls) && other.accessesMutableStruct()) ||
        ((other.writesStruct || other.calls) && accessesMutableStruct()) ||
        ((writesArray || calls) && other.accessesArray()) ||
        ((other.writesArray || other.calls) && accessesArray()) ||
        (danglingPop || other.danglingPop)) {
      return true;
    }
    // All atomics are sequentially consistent for now, and ordered wrt other
    // memory references.
    if ((isAtomic && other.accessesMemory()) ||
        (other.isAtomic && accessesMemory())) {
      return true;
    }
    for (auto local : localsWritten) {
      if (other.localsRead.count(local) || other.localsWritten.count(local)) {
        return true;
      }
    }
    for (auto local : localsRead) {
      if (other.localsWritten.count(local)) {
        return true;
      }
    }
    if ((other.calls && accessesMutableGlobal()) ||
        (calls && other.accessesMutableGlobal())) {
      return true;
    }
    for (auto global : globalsWritten) {
      if (other.mutableGlobalsRead.count(global) ||
          other.globalsWritten.count(global)) {
        return true;
      }
    }
    for (auto global : mutableGlobalsRead) {
      if (other.globalsWritten.count(global)) {
        return true;
      }
    }
    // We are ok to reorder implicit traps, but not conditionalize them.
    if ((trap && other.transfersControlFlow()) ||
        (other.trap && transfersControlFlow())) {
      return true;
    }
    // Note that the above includes disallowing the reordering of a trap with an
    // exception (as an exception can transfer control flow inside the current
    // function, so transfersControlFlow would be true) - while we allow the
    // reordering of traps with each other, we do not reorder exceptions with
    // anything.
    assert(!((trap && other.throws()) || (throws() && other.trap)));
    // We can't reorder an implicit trap in a way that could alter what global
    // state is modified.
    if ((trap && other.writesGlobalState()) ||
        (other.trap && writesGlobalState())) {
      return true;
    }
    return false;
  }